

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpressionResult.cpp
# Opt level: O0

JavascriptArray *
Js::JavascriptRegularExpressionResult::Create
          (void *stackAllocationPointer,JavascriptString *input,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  JavascriptLibrary *this;
  DynamicType *arrayType;
  JavascriptArray *arr_00;
  undefined4 *puVar3;
  JavascriptArray *arr;
  ScriptContext *scriptContext_local;
  JavascriptString *input_local;
  void *stackAllocationPointer_local;
  
  this = ScriptContext::GetLibrary(scriptContext);
  arrayType = JavascriptLibrary::GetRegexResultType(this);
  arr_00 = Js::JavascriptArray::New<Js::JavascriptArray,2u>(stackAllocationPointer,0,arrayType);
  bVar2 = Is(arr_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpressionResult.cpp"
                                ,0x10,"(JavascriptRegularExpressionResult::Is(arr))",
                                "JavascriptRegularExpressionResult::Is(arr)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)BuiltInPropertyRecords::input);
  DynamicObject::SetSlot((DynamicObject *)arr_00,propertyId,false,0,input);
  return arr_00;
}

Assistant:

JavascriptArray* JavascriptRegularExpressionResult::Create(
        void *const stackAllocationPointer,
        JavascriptString* input,
        ScriptContext* const scriptContext)
    {
        JavascriptArray* arr = JavascriptArray::New<JavascriptArray, InlineSlotCount>(stackAllocationPointer, 0, scriptContext->GetLibrary()->GetRegexResultType()); // use default array capacity

        Assert(JavascriptRegularExpressionResult::Is(arr));
        arr->SetSlot(SetSlotArguments(BuiltInPropertyRecords::input.propertyRecord.GetPropertyId(), InputIndex, input));

        // SetMatch must be called with a valid match before the object is given to script code
        // Each item will be filled in by the match loop
        return arr;
    }